

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.hpp
# Opt level: O2

void boost::algorithm::trim_right_if<std::__cxx11::string,boost::algorithm::detail::is_classifiedF>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Input,
               is_classifiedF *IsSpace)

{
  size_type sVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  is_classifiedF local_30;
  
  _Var2._M_current = (Input->_M_dataplus)._M_p;
  sVar1 = Input->_M_string_length;
  detail::is_classifiedF::is_classifiedF(&local_30,IsSpace);
  _Var2 = detail::
          trim_end<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,boost::algorithm::detail::is_classifiedF>
                    (_Var2,_Var2._M_current + sVar1,&local_30);
  std::__cxx11::string::erase
            (Input,_Var2._M_current,(Input->_M_dataplus)._M_p + Input->_M_string_length);
  std::locale::~locale(&local_30.m_Locale);
  return;
}

Assistant:

inline void trim_right_if(SequenceT& Input, PredicateT IsSpace)
        {
            Input.erase(
                ::boost::algorithm::detail::trim_end( 
                    ::boost::begin(Input), 
                    ::boost::end(Input), 
                    IsSpace ),
                ::boost::end(Input)
                );
        }